

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O0

uint64_t aom_var_2d_u8_avx2(uint8_t *src,int src_stride,int width,int height)

{
  byte bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  __m256i vec_a;
  __m256i vec_a_00;
  __m256i vec_a_01;
  __m256i vec_a_02;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int32_t iVar11;
  int in_ECX;
  long lVar12;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint8_t val;
  int m;
  int k_2;
  __m256i vsqs1_1;
  __m256i vsqs0_1;
  __m256i vsrc1_1;
  __m256i vsrc0_1;
  __m256i vsrc_1;
  __m256i vsqs1;
  __m256i vsqs0;
  __m256i vsrc1;
  __m256i vsrc0;
  int k_1;
  int k;
  __m256i vsrc [8];
  int j;
  int i;
  __m256i v_acc_sqs;
  __m256i v_acc_sum;
  __m256i vzero;
  uint64_t ss;
  uint64_t s;
  uint8_t *srcp;
  undefined4 in_stack_fffffffffffff878;
  int iVar13;
  undefined4 in_stack_fffffffffffff87c;
  int iVar14;
  undefined8 in_stack_fffffffffffff880;
  undefined8 in_stack_fffffffffffff888;
  longlong in_stack_fffffffffffff890;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  int local_648;
  int local_644;
  undefined8 local_640 [35];
  int local_528;
  int local_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  long local_4b0;
  long local_4a8;
  undefined1 (*local_4a0) [32];
  int local_494;
  int local_490;
  int local_48c;
  long local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 (*local_450) [32];
  undefined1 (*local_448) [32];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  longlong lStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_4a8 = 0;
  local_4b0 = 0;
  local_480 = 0;
  uStack_478 = 0;
  uStack_470 = 0;
  uStack_468 = 0;
  local_4e0 = 0;
  uStack_4d8 = 0;
  uStack_4d0 = 0;
  uStack_4c8 = 0;
  local_500._0_16_ = ZEXT816(0);
  local_500 = ZEXT1632(local_500._0_16_);
  local_520._0_16_ = ZEXT816(0);
  local_520 = ZEXT1632(local_520._0_16_);
  local_494 = in_ECX;
  local_490 = in_EDX;
  local_48c = in_ESI;
  local_488 = in_RDI;
  for (local_524 = 0; local_524 < local_490 + -0x1f; local_524 = local_524 + 0x20) {
    local_4a0 = (undefined1 (*) [32])(local_488 + local_524);
    for (local_528 = 0; local_528 < local_494 + -7; local_528 = local_528 + 8) {
      for (local_644 = 0; local_644 < 8; local_644 = local_644 + 1) {
        local_448 = local_4a0;
        uVar5 = *(undefined8 *)(*local_4a0 + 8);
        uVar6 = *(undefined8 *)(*local_4a0 + 0x10);
        uVar7 = *(undefined8 *)(*local_4a0 + 0x18);
        lVar12 = (long)local_644;
        local_640[lVar12 * 4] = *(undefined8 *)*local_4a0;
        local_640[lVar12 * 4 + 1] = uVar5;
        local_640[lVar12 * 4 + 2] = uVar6;
        local_640[lVar12 * 4 + 3] = uVar7;
        local_4a0 = (undefined1 (*) [32])(*local_4a0 + local_48c);
      }
      for (local_648 = 0; local_648 < 8; local_648 = local_648 + 1) {
        lVar12 = (long)local_648;
        local_3e0 = local_640[lVar12 * 4];
        uStack_3d8 = local_640[lVar12 * 4 + 1];
        uStack_3d0 = local_640[lVar12 * 4 + 2];
        uStack_3c8 = local_640[lVar12 * 4 + 3];
        local_400 = local_4e0;
        uStack_3f8 = uStack_4d8;
        uStack_3f0 = uStack_4d0;
        uStack_3e8 = uStack_4c8;
        auVar3._8_8_ = uStack_3d8;
        auVar3._0_8_ = local_3e0;
        auVar3._16_8_ = uStack_3d0;
        auVar3._24_8_ = uStack_3c8;
        auVar2._8_8_ = uStack_4d8;
        auVar2._0_8_ = local_4e0;
        auVar2._16_8_ = uStack_4d0;
        auVar2._24_8_ = uStack_4c8;
        auVar4 = vpunpcklbw_avx2(auVar3,auVar2);
        lVar12 = (long)local_648;
        local_360 = local_640[lVar12 * 4];
        uStack_358 = local_640[lVar12 * 4 + 1];
        uStack_350 = local_640[lVar12 * 4 + 2];
        uStack_348 = local_640[lVar12 * 4 + 3];
        local_380 = local_4e0;
        uStack_378 = uStack_4d8;
        uStack_370 = uStack_4d0;
        uStack_368 = uStack_4c8;
        auVar10._8_8_ = uStack_358;
        auVar10._0_8_ = local_360;
        auVar10._16_8_ = uStack_350;
        auVar10._24_8_ = uStack_348;
        auVar9._8_8_ = uStack_4d8;
        auVar9._0_8_ = local_4e0;
        auVar9._16_8_ = uStack_4d0;
        auVar9._24_8_ = uStack_4c8;
        auVar3 = vpunpckhbw_avx2(auVar10,auVar9);
        local_260 = local_500._0_8_;
        uStack_258 = local_500._8_8_;
        uStack_250 = local_500._16_8_;
        uStack_248 = local_500._24_8_;
        local_680 = auVar4._0_8_;
        local_280 = local_680;
        uStack_678 = auVar4._8_8_;
        uStack_278 = uStack_678;
        uStack_670 = auVar4._16_8_;
        uStack_270 = uStack_670;
        uStack_668 = auVar4._24_8_;
        uStack_268 = uStack_668;
        auVar2 = vpaddw_avx2(local_500,auVar4);
        local_500._0_8_ = auVar2._0_8_;
        local_2a0 = local_500._0_8_;
        local_500._8_8_ = auVar2._8_8_;
        uStack_298 = local_500._8_8_;
        local_500._16_8_ = auVar2._16_8_;
        uStack_290 = local_500._16_8_;
        local_500._24_8_ = auVar2._24_8_;
        uStack_288 = local_500._24_8_;
        local_6a0 = auVar3._0_8_;
        local_2c0 = local_6a0;
        uStack_698 = auVar3._8_8_;
        uStack_2b8 = uStack_698;
        uStack_690 = auVar3._16_8_;
        uStack_2b0 = uStack_690;
        uStack_688 = auVar3._24_8_;
        uStack_2a8 = uStack_688;
        local_500 = vpaddw_avx2(auVar2,auVar3);
        local_160 = local_680;
        uStack_158 = uStack_678;
        uStack_150 = uStack_670;
        uStack_148 = uStack_668;
        local_180 = local_680;
        uStack_178 = uStack_678;
        uStack_170 = uStack_670;
        uStack_168 = uStack_668;
        auVar2 = vpmaddwd_avx2(auVar4,auVar4);
        local_1a0 = local_6a0;
        uStack_198 = uStack_698;
        uStack_190 = uStack_690;
        uStack_188 = uStack_688;
        local_1c0 = local_6a0;
        uStack_1b8 = uStack_698;
        uStack_1b0 = uStack_690;
        uStack_1a8 = uStack_688;
        auVar3 = vpmaddwd_avx2(auVar3,auVar3);
        local_60 = local_520._0_8_;
        uStack_58 = local_520._8_8_;
        uStack_50 = local_520._16_8_;
        uStack_48 = local_520._24_8_;
        local_6c0 = auVar2._0_8_;
        local_80 = local_6c0;
        uStack_6b8 = auVar2._8_8_;
        uStack_78 = uStack_6b8;
        uStack_6b0 = auVar2._16_8_;
        uStack_70 = uStack_6b0;
        uStack_6a8 = auVar2._24_8_;
        uStack_68 = uStack_6a8;
        auVar2 = vpaddd_avx2(local_520,auVar2);
        local_520._0_8_ = auVar2._0_8_;
        local_a0 = local_520._0_8_;
        local_520._8_8_ = auVar2._8_8_;
        uStack_98 = local_520._8_8_;
        local_520._16_8_ = auVar2._16_8_;
        uStack_90 = local_520._16_8_;
        local_520._24_8_ = auVar2._24_8_;
        uStack_88 = local_520._24_8_;
        local_6e0 = auVar3._0_8_;
        local_c0 = local_6e0;
        uStack_6d8 = auVar3._8_8_;
        uStack_b8 = uStack_6d8;
        uStack_6d0 = auVar3._16_8_;
        uStack_b0 = uStack_6d0;
        uStack_6c8 = auVar3._24_8_;
        uStack_a8 = uStack_6c8;
        local_520 = vpaddd_avx2(auVar2,auVar3);
      }
      vec_a[0]._4_4_ = in_stack_fffffffffffff87c;
      vec_a[0]._0_4_ = in_stack_fffffffffffff878;
      vec_a[1] = in_stack_fffffffffffff880;
      vec_a[2] = in_stack_fffffffffffff888;
      vec_a[3] = in_stack_fffffffffffff890;
      iVar11 = mm256_accumulate_epi16(vec_a);
      local_4a8 = iVar11 + local_4a8;
      vec_a_00[0]._4_4_ = in_stack_fffffffffffff87c;
      vec_a_00[0]._0_4_ = in_stack_fffffffffffff878;
      vec_a_00[1] = in_stack_fffffffffffff880;
      vec_a_00[2] = in_stack_fffffffffffff888;
      vec_a_00[3] = in_stack_fffffffffffff890;
      iVar11 = mm256_accumulate_epi32(vec_a_00);
      local_4b0 = iVar11 + local_4b0;
      local_500._8_8_ = uStack_4d8;
      local_500._0_8_ = local_4e0;
      local_500._16_8_ = uStack_4d0;
      local_500._24_8_ = uStack_4c8;
      local_520._8_8_ = uStack_4d8;
      local_520._0_8_ = local_4e0;
      local_520._16_8_ = uStack_4d0;
      local_520._24_8_ = uStack_4c8;
    }
    for (; local_528 < local_494; local_528 = local_528 + 1) {
      local_450 = local_4a0;
      local_420 = *(undefined8 *)*local_4a0;
      uStack_418 = *(undefined8 *)(*local_4a0 + 8);
      uStack_410 = *(undefined8 *)(*local_4a0 + 0x10);
      uStack_408 = *(undefined8 *)(*local_4a0 + 0x18);
      local_440 = local_4e0;
      uStack_438 = uStack_4d8;
      uStack_430 = uStack_4d0;
      uStack_428 = uStack_4c8;
      auVar4._8_8_ = uStack_4d8;
      auVar4._0_8_ = local_4e0;
      auVar4._16_8_ = uStack_4d0;
      auVar4._24_8_ = uStack_4c8;
      auVar4 = vpunpcklbw_avx2(*local_4a0,auVar4);
      local_3c0 = local_4e0;
      uStack_3b8 = uStack_4d8;
      uStack_3b0 = uStack_4d0;
      uStack_3a8 = uStack_4c8;
      auVar8._8_8_ = uStack_4d8;
      auVar8._0_8_ = local_4e0;
      auVar8._16_8_ = uStack_4d0;
      auVar8._24_8_ = uStack_4c8;
      auVar3 = vpunpckhbw_avx2(*local_4a0,auVar8);
      local_2e0 = local_500._0_8_;
      uStack_2d8 = local_500._8_8_;
      uStack_2d0 = local_500._16_8_;
      uStack_2c8 = local_500._24_8_;
      local_720 = auVar4._0_8_;
      local_300 = local_720;
      uStack_718 = auVar4._8_8_;
      uStack_2f8 = uStack_718;
      uStack_710 = auVar4._16_8_;
      uStack_2f0 = uStack_710;
      uStack_708 = auVar4._24_8_;
      uStack_2e8 = uStack_708;
      auVar2 = vpaddw_avx2(local_500,auVar4);
      local_500._0_8_ = auVar2._0_8_;
      local_320 = local_500._0_8_;
      local_500._8_8_ = auVar2._8_8_;
      uStack_318 = local_500._8_8_;
      local_500._16_8_ = auVar2._16_8_;
      uStack_310 = local_500._16_8_;
      local_500._24_8_ = auVar2._24_8_;
      uStack_308 = local_500._24_8_;
      local_740 = auVar3._0_8_;
      local_340 = local_740;
      uStack_738 = auVar3._8_8_;
      uStack_338 = uStack_738;
      uStack_730 = auVar3._16_8_;
      uStack_330 = uStack_730;
      uStack_728 = auVar3._24_8_;
      uStack_328 = uStack_728;
      local_500 = vpaddw_avx2(auVar2,auVar3);
      local_1e0 = local_720;
      uStack_1d8 = uStack_718;
      uStack_1d0 = uStack_710;
      uStack_1c8 = uStack_708;
      local_200 = local_720;
      uStack_1f8 = uStack_718;
      uStack_1f0 = uStack_710;
      uStack_1e8 = uStack_708;
      auVar2 = vpmaddwd_avx2(auVar4,auVar4);
      local_220 = local_740;
      uStack_218 = uStack_738;
      uStack_210 = uStack_730;
      uStack_208 = uStack_728;
      local_240 = local_740;
      uStack_238 = uStack_738;
      uStack_230 = uStack_730;
      uStack_228 = uStack_728;
      auVar3 = vpmaddwd_avx2(auVar3,auVar3);
      in_stack_fffffffffffff880 = auVar3._0_8_;
      in_stack_fffffffffffff888 = auVar3._8_8_;
      in_stack_fffffffffffff890 = auVar3._16_8_;
      uStack_768 = auVar3._24_8_;
      local_e0 = local_520._0_8_;
      uStack_d8 = local_520._8_8_;
      uStack_d0 = local_520._16_8_;
      uStack_c8 = local_520._24_8_;
      local_760 = auVar2._0_8_;
      local_100 = local_760;
      uStack_758 = auVar2._8_8_;
      uStack_f8 = uStack_758;
      uStack_750 = auVar2._16_8_;
      uStack_f0 = uStack_750;
      uStack_748 = auVar2._24_8_;
      uStack_e8 = uStack_748;
      auVar2 = vpaddd_avx2(local_520,auVar2);
      local_520._0_8_ = auVar2._0_8_;
      local_120 = local_520._0_8_;
      local_520._8_8_ = auVar2._8_8_;
      uStack_118 = local_520._8_8_;
      local_520._16_8_ = auVar2._16_8_;
      uStack_110 = local_520._16_8_;
      local_520._24_8_ = auVar2._24_8_;
      uStack_108 = local_520._24_8_;
      uStack_128 = uStack_768;
      local_520 = vpaddd_avx2(auVar2,auVar3);
      local_4a0 = (undefined1 (*) [32])(*local_4a0 + local_48c);
      local_3a0 = local_420;
      uStack_398 = uStack_418;
      uStack_390 = uStack_410;
      uStack_388 = uStack_408;
      local_140 = in_stack_fffffffffffff880;
      uStack_138 = in_stack_fffffffffffff888;
      lStack_130 = in_stack_fffffffffffff890;
    }
    vec_a_01[0]._4_4_ = in_stack_fffffffffffff87c;
    vec_a_01[0]._0_4_ = in_stack_fffffffffffff878;
    vec_a_01[1] = in_stack_fffffffffffff880;
    vec_a_01[2] = in_stack_fffffffffffff888;
    vec_a_01[3] = in_stack_fffffffffffff890;
    iVar11 = mm256_accumulate_epi16(vec_a_01);
    local_4a8 = iVar11 + local_4a8;
    vec_a_02[0]._4_4_ = in_stack_fffffffffffff87c;
    vec_a_02[0]._0_4_ = in_stack_fffffffffffff878;
    vec_a_02[1] = in_stack_fffffffffffff880;
    vec_a_02[2] = in_stack_fffffffffffff888;
    vec_a_02[3] = in_stack_fffffffffffff890;
    iVar11 = mm256_accumulate_epi32(vec_a_02);
    local_4b0 = iVar11 + local_4b0;
    local_500._8_8_ = uStack_4d8;
    local_500._0_8_ = local_4e0;
    local_500._16_8_ = uStack_4d0;
    local_500._24_8_ = uStack_4c8;
    local_520._8_8_ = uStack_4d8;
    local_520._0_8_ = local_4e0;
    local_520._16_8_ = uStack_4d0;
    local_520._24_8_ = uStack_4c8;
  }
  local_4a0 = (undefined1 (*) [32])local_488;
  for (iVar14 = 0; iVar13 = local_524, iVar14 < local_494; iVar14 = iVar14 + 1) {
    for (; iVar13 < local_490; iVar13 = iVar13 + 1) {
      bVar1 = *(byte *)((long)local_4a0 + (long)iVar13);
      local_4a8 = (ulong)bVar1 + local_4a8;
      local_4b0 = (int)((uint)bVar1 * (uint)bVar1) + local_4b0;
    }
    local_4a0 = (undefined1 (*) [32])((long)local_4a0 + (long)local_48c);
  }
  return local_4b0 - (ulong)(local_4a8 * local_4a8) / (ulong)(long)(local_490 * local_494);
}

Assistant:

uint64_t aom_var_2d_u8_avx2(uint8_t *src, int src_stride, int width,
                            int height) {
  uint8_t *srcp;
  uint64_t s = 0, ss = 0;
  __m256i vzero = _mm256_setzero_si256();
  __m256i v_acc_sum = vzero;
  __m256i v_acc_sqs = vzero;
  int i, j;

  // Process 32 elements in a row
  for (i = 0; i < width - 31; i += 32) {
    srcp = src + i;
    // Process 8 columns at a time
    for (j = 0; j < height - 7; j += 8) {
      __m256i vsrc[8];
      for (int k = 0; k < 8; k++) {
        vsrc[k] = _mm256_loadu_si256((__m256i *)srcp);
        srcp += src_stride;
      }
      for (int k = 0; k < 8; k++) {
        __m256i vsrc0 = _mm256_unpacklo_epi8(vsrc[k], vzero);
        __m256i vsrc1 = _mm256_unpackhi_epi8(vsrc[k], vzero);
        v_acc_sum = _mm256_add_epi16(v_acc_sum, vsrc0);
        v_acc_sum = _mm256_add_epi16(v_acc_sum, vsrc1);

        __m256i vsqs0 = _mm256_madd_epi16(vsrc0, vsrc0);
        __m256i vsqs1 = _mm256_madd_epi16(vsrc1, vsrc1);
        v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs0);
        v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs1);
      }

      // Update total sum and clear the vectors
      s += mm256_accumulate_epi16(v_acc_sum);
      ss += mm256_accumulate_epi32(v_acc_sqs);
      v_acc_sum = vzero;
      v_acc_sqs = vzero;
    }

    // Process remaining rows (height not a multiple of 8)
    for (; j < height; j++) {
      __m256i vsrc = _mm256_loadu_si256((__m256i *)srcp);
      __m256i vsrc0 = _mm256_unpacklo_epi8(vsrc, vzero);
      __m256i vsrc1 = _mm256_unpackhi_epi8(vsrc, vzero);
      v_acc_sum = _mm256_add_epi16(v_acc_sum, vsrc0);
      v_acc_sum = _mm256_add_epi16(v_acc_sum, vsrc1);

      __m256i vsqs0 = _mm256_madd_epi16(vsrc0, vsrc0);
      __m256i vsqs1 = _mm256_madd_epi16(vsrc1, vsrc1);
      v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs0);
      v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs1);

      srcp += src_stride;
    }

    // Update total sum and clear the vectors
    s += mm256_accumulate_epi16(v_acc_sum);
    ss += mm256_accumulate_epi32(v_acc_sqs);
    v_acc_sum = vzero;
    v_acc_sqs = vzero;
  }

  // Process the remaining area using C
  srcp = src;
  for (int k = 0; k < height; k++) {
    for (int m = i; m < width; m++) {
      uint8_t val = srcp[m];
      s += val;
      ss += val * val;
    }
    srcp += src_stride;
  }
  return (ss - s * s / (width * height));
}